

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form4_ProjectionProfile(ProjectionProfileForm4 ProjectionProfile)

{
  uint uVar1;
  byte value;
  uint uVar2;
  int iVar3;
  undefined1 auVar4 [8];
  _func_int **pp_Var5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> projection;
  Image image;
  uint32_t local_88;
  uint32_t local_84;
  uint32_t local_80;
  uint32_t local_7c;
  undefined1 local_78 [8];
  _func_int **pp_Stack_70;
  undefined8 local_68;
  Image local_50;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)local_78,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_50,value,0,0,(ImageTemplate<unsigned_char> *)local_78);
  local_78 = (undefined1  [8])&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_78);
  Unit_Test::generateRoi(&local_50,&local_7c,&local_80,&local_84,&local_88);
  uVar2 = rand();
  local_68._0_1_ = '\0';
  local_68._1_1_ = '\0';
  local_68._2_2_ = 0;
  local_68._4_4_ = 0;
  local_78 = (undefined1  [8])0x0;
  pp_Stack_70 = (_func_int **)0x0;
  (*ProjectionProfile)
            (&local_50,local_7c,local_80,local_84,local_88,(uVar2 & 1) == 0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
  uVar1 = local_88;
  if ((uVar2 & 1) == 0) {
    uVar1 = local_84;
    local_84 = local_88;
  }
  uVar7 = (long)pp_Stack_70 - (long)local_78;
  if ((long)uVar7 >> 2 != (ulong)uVar1) {
    bVar8 = false;
    goto LAB_001554d5;
  }
  iVar3 = local_84 * value;
  auVar4 = local_78;
  if (0 < (long)uVar7 >> 4) {
    lVar6 = ((long)uVar7 >> 4) + 1;
    pp_Var5 = (_func_int **)((long)local_78 + 8);
    auVar4 = (undefined1  [8])((uVar7 & 0xfffffffffffffff0) + (long)local_78);
    do {
      if (*(int *)(pp_Var5 + -1) != iVar3) {
        pp_Var5 = pp_Var5 + -1;
        goto LAB_001554cf;
      }
      if (*(int *)((long)pp_Var5 + -4) != iVar3) {
        pp_Var5 = (_func_int **)((long)pp_Var5 + -4);
        goto LAB_001554cf;
      }
      if (*(int *)pp_Var5 != iVar3) goto LAB_001554cf;
      if (*(int *)((long)pp_Var5 + 4) != iVar3) {
        pp_Var5 = (_func_int **)((long)pp_Var5 + 4);
        goto LAB_001554cf;
      }
      lVar6 = lVar6 + -1;
      pp_Var5 = pp_Var5 + 2;
    } while (1 < lVar6);
    uVar7 = (long)pp_Stack_70 - (long)auVar4;
  }
  lVar6 = (long)uVar7 >> 2;
  if (lVar6 == 1) {
LAB_001554b4:
    pp_Var5 = (_func_int **)auVar4;
    if (*(int *)auVar4 == iVar3) {
      pp_Var5 = pp_Stack_70;
    }
  }
  else if (lVar6 == 2) {
LAB_001554ac:
    pp_Var5 = (_func_int **)auVar4;
    if (*(int *)auVar4 == iVar3) {
      auVar4 = (undefined1  [8])((long)auVar4 + 4);
      goto LAB_001554b4;
    }
  }
  else {
    pp_Var5 = pp_Stack_70;
    if ((lVar6 == 3) && (pp_Var5 = (_func_int **)auVar4, *(int *)auVar4 == iVar3)) {
      auVar4 = (undefined1  [8])((long)auVar4 + 4);
      goto LAB_001554ac;
    }
  }
LAB_001554cf:
  bVar8 = pp_Var5 == pp_Stack_70;
LAB_001554d5:
  if (local_78 != (undefined1  [8])0x0) {
    operator_delete((void *)local_78);
  }
  local_50._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_50);
  return bVar8;
}

Assistant:

bool form4_ProjectionProfile(ProjectionProfileForm4 ProjectionProfile)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );

        const bool horizontal = (randomValue<int>(2) == 0);

        std::vector < uint32_t > projection;
        ProjectionProfile( image, roiX, roiY, roiWidth, roiHeight, horizontal, projection );

        const uint32_t value = (horizontal ? roiHeight : roiWidth) * intensity;

        return projection.size() == (horizontal ? roiWidth : roiHeight) &&
            std::all_of( projection.begin(), projection.end(), [&value]( uint32_t v ) { return value == v; } );
    }